

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O3

void __thiscall nuraft::asio_service_impl::stop(asio_service_impl *this)

{
  mutex *__mutex;
  size_t *psVar1;
  impl_type *piVar2;
  byte bVar3;
  long lVar4;
  char cVar5;
  _List_node_base *p_Var6;
  bool bVar7;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_38;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  
  LOCK();
  bVar7 = (this->continue_).super___atomic_base<int>._M_i == 1;
  if (bVar7) {
    (this->continue_).super___atomic_base<int>._M_i = 0;
  }
  UNLOCK();
  if (bVar7) {
    local_38._M_device = &this->stopping_lock_;
    local_38._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_38);
    local_38._M_owns = true;
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::cancel(&this->asio_timer_);
    LOCK();
    bVar7 = (this->stopping_status_).super___atomic_base<unsigned_char>._M_i == '\0';
    if (bVar7) {
      (this->stopping_status_).super___atomic_base<unsigned_char>._M_i = '\x01';
    }
    UNLOCK();
    if (bVar7) {
      lVar4 = std::chrono::_V2::steady_clock::now();
      local_28.__d.__r = (duration)(lVar4 + 1000000000);
      std::condition_variable::
      __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                (&this->stopping_cv_,&local_38,&local_28);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_38);
  }
  LOCK();
  (this->stopping_status_).super___atomic_base<unsigned_char>._M_i = '\x01';
  UNLOCK();
  piVar2 = (this->io_svc_).impl_;
  bVar7 = (piVar2->mutex_).enabled_;
  bVar3 = bVar7;
  if (bVar7 == true) {
    pthread_mutex_lock((pthread_mutex_t *)&(piVar2->mutex_).mutex_);
    bVar3 = (piVar2->mutex_).enabled_;
  }
  piVar2->stopped_ = true;
  if ((bVar3 & 1) != 0) {
    psVar1 = &(piVar2->wakeup_event_).event_.state_;
    *(byte *)psVar1 = (byte)*psVar1 | 1;
    pthread_cond_broadcast((pthread_cond_t *)&(piVar2->wakeup_event_).event_);
  }
  if ((piVar2->task_interrupted_ == false) && (piVar2->task_ != (scheduler_task *)0x0)) {
    piVar2->task_interrupted_ = true;
    (*piVar2->task_->_vptr_scheduler_task[1])();
  }
  if (bVar7 != false) {
    pthread_mutex_unlock((pthread_mutex_t *)&(piVar2->mutex_).mutex_);
  }
  while( true ) {
    piVar2 = (this->io_svc_).impl_;
    if ((piVar2->mutex_).enabled_ == false) {
      cVar5 = piVar2->stopped_;
    }
    else {
      __mutex = &(piVar2->mutex_).mutex_;
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      cVar5 = piVar2->stopped_;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    if (cVar5 != '\0') break;
    sched_yield();
  }
  for (p_Var6 = (this->worker_handles_).
                super__List_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var6 != (_List_node_base *)&this->worker_handles_; p_Var6 = p_Var6->_M_next) {
    if ((p_Var6[1]._M_next != (_List_node_base *)0x0) &&
       ((p_Var6[1]._M_next)->_M_next != (_List_node_base *)0x0)) {
      std::thread::join();
    }
  }
  return;
}

Assistant:

void asio_service_impl::stop() {
    int running = 1;
    if (continue_.compare_exchange_strong(running, 0)) {
        std::unique_lock<std::mutex> lock(stopping_lock_);
        asio_timer_.cancel();

        uint8_t exp = 0;
        if (stopping_status_.compare_exchange_strong(exp, 1)) {
            // 0 means that timer_handler() is not yet called.
            // make it 1, timer_handler() will call notify().
            stopping_cv_.wait_for(lock, std::chrono::seconds(1));
        }
    }

    // Stop all workers.
    stopping_status_ = 1;

    io_svc_.stop();
    while (!io_svc_.stopped()) {
        std::this_thread::yield();
    }

    for (ptr<std::thread>& t: worker_handles_) {
        if (t && t->joinable()) {
            t->join();
        }
    }
}